

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectFlat<float,float,duckdb::GreaterThan,false,true>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  float *ldata;
  float *rdata;
  unsigned_long *puVar1;
  idx_t i;
  idx_t iVar2;
  idx_t iVar3;
  
  ldata = (float *)left->data;
  rdata = (float *)right->data;
  puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
    FlatVector::VerifyFlatVector(left);
    iVar2 = SelectFlatLoopSwitch<float,float,duckdb::GreaterThan,false,true>
                      (ldata,rdata,sel,count,&left->validity,true_sel,false_sel);
  }
  else {
    if (false_sel != (SelectionVector *)0x0) {
      for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
        iVar3 = iVar2;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)sel->sel_vector[iVar2];
        }
        false_sel->sel_vector[iVar2] = (sel_t)iVar3;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static idx_t SelectFlat(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                        SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if (LEFT_CONSTANT && ConstantVector::IsNull(left)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}
		if (RIGHT_CONSTANT && ConstantVector::IsNull(right)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}

		if (LEFT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(right), true_sel, false_sel);
		} else if (RIGHT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(left), true_sel, false_sel);
		} else {
			ValidityMask combined_mask = FlatVector::Validity(left);
			combined_mask.Combine(FlatVector::Validity(right), count);
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, combined_mask, true_sel, false_sel);
		}
	}